

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,ReporterConfig *other)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (other->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->name)._M_string_length);
  this->stream = other->stream;
  this->includeSuccessfulResults = other->includeSuccessfulResults;
  ConfigData::ConfigData(&this->fullConfig,&other->fullConfig);
  return;
}

Assistant:

ReporterConfig( const ReporterConfig& other )
        :   name( other.name ),
            stream( other.stream ),
            includeSuccessfulResults( other.includeSuccessfulResults ),
            fullConfig( other.fullConfig )
        {}